

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

uint32_t __thiscall
DnsStats::CountDnsNameParts(DnsStats *this,uint8_t *packet,uint32_t length,uint32_t start)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  
  uVar2 = 0;
  if (start < length) {
    uVar2 = 0;
    uVar3 = start;
    while( true ) {
      bVar1 = packet[uVar3];
      if (bVar1 == 0) break;
      uVar4 = (uint)bVar1;
      if ((~uVar4 & 0xc0) == 0) {
        if (length < uVar3 + 2) {
          return uVar2;
        }
        uVar3 = (uint)packet[(ulong)uVar3 + 1] | (uVar4 & 0x3f) << 8;
        if (start <= uVar3) {
          return uVar2;
        }
      }
      else {
        if (0x3f < bVar1) {
          return uVar2;
        }
        uVar3 = uVar3 + uVar4 + 1;
        if (length < uVar3) {
          return uVar2;
        }
        uVar2 = uVar2 + 1;
      }
      if (length <= uVar3) {
        return uVar2;
      }
    }
  }
  return uVar2;
}

Assistant:

uint32_t DnsStats::CountDnsNameParts(uint8_t* packet, uint32_t length, uint32_t start)
{
    uint32_t l = 0;
    uint32_t name_start = start;
    uint32_t nb_parts = 0;

    while (start < length) {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            if ((start + 2) > length)
            {
                /* error */
                break;
            }
            else
            {
                uint32_t new_start = ((l & 63) << 8) + packet[start + 1];

                if (new_start < name_start)
                {
                    start = new_start;
                }
                else {
                    /* Basic restriction to avoid name decoding loops */
                    break;
                }
            }
        }
        else if (l > 0x3F)
        {
            /* found an extension. Don't know how to parse it! */
            break;
        }
        else
        {
            /* add a label to the name. */
            if (start + l + 1 > length)
            {
                /* format error */
                break;
            }
            else
            {
                nb_parts++;
                start += l + 1;
            }
        }
    }


    return nb_parts;
}